

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  int iVar1;
  size_t sVar2;
  xmlChar *__s;
  long lVar3;
  int local_444;
  int c_in;
  int c_out;
  xmlChar buf [1024];
  
  if (out == (xmlOutputBufferPtr)0x0) {
    return -1;
  }
  if (str == (xmlChar *)0x0) {
    return -1;
  }
  if (out->error != 0) {
    return -1;
  }
  sVar2 = strlen((char *)str);
  if (sVar2 < 0x7fffffff) {
    if (escaping != (xmlCharEncodingOutputFunc)0x0) {
      local_444 = 0;
      while( true ) {
        if (sVar2 == 0) {
          return local_444;
        }
        c_out = 0x400;
        c_in = (int)sVar2;
        iVar1 = (*escaping)(buf,&c_out,str,&c_in);
        if (iVar1 < 0) break;
        lVar3 = (long)c_in;
        iVar1 = xmlOutputBufferWrite(out,c_out,(char *)buf);
        if (iVar1 < 0) {
          return iVar1;
        }
        sVar2 = sVar2 - lVar3;
        str = str + lVar3;
        local_444 = local_444 + iVar1;
      }
      out->error = 2;
      return -1;
    }
    __s = xmlEscapeText(str,0x10);
    if (__s == (xmlChar *)0x0) {
      out->error = 2;
      return -1;
    }
    sVar2 = strlen((char *)__s);
    if (sVar2 < 0x7fffffff) {
      iVar1 = xmlOutputBufferWrite(out,(int)sVar2,(char *)__s);
      (*xmlFree)(__s);
      return iVar1;
    }
  }
  out->error = 0x72;
  return -1;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int ret;
    int written = 0;
    size_t len;

    if ((out == NULL) || (out->error) || (str == NULL))
        return(-1);

    len = strlen((const char *) str);
    if (len >= INT_MAX) {
        out->error = XML_ERR_RESOURCE_LIMIT;
        return(-1);
    }

    if (escaping == NULL) {
        char *escaped = (char *) xmlEscapeText(str, XML_ESCAPE_ALLOW_INVALID);

        if (escaped == NULL) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

        len = strlen(escaped);
        if (len >= INT_MAX) {
            out->error = XML_ERR_RESOURCE_LIMIT;
            return(-1);
        }

        ret = xmlOutputBufferWrite(out, len, escaped);

        xmlFree(escaped);
        return(ret);
    }

    while (len > 0) {
        xmlChar buf[1024];
        int c_out;
        int c_in;

	c_out = 1024;
	c_in = len;

        ret = escaping(buf, &c_out, str, &c_in);
        if (ret < 0) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
        str += c_in;
        len -= c_in;

        ret = xmlOutputBufferWrite(out, c_out, (char *) buf);
        if (ret < 0)
            return(ret);
        written += ret;
    }

    return(written);
}